

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClosedFileInputSource.cc
# Opt level: O2

void __thiscall ClosedFileInputSource::~ClosedFileInputSource(ClosedFileInputSource *this)

{
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__ClosedFileInputSource_002abbb0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fis).super___shared_ptr<FileInputSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->filename);
  return;
}

Assistant:

ClosedFileInputSource::~ClosedFileInputSource() // NOLINT (modernize-use-equals-default)
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
}